

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEExecOptions.h
# Opt level: O0

void __thiscall CEExecOptions::AddCirsPars(CEExecOptions *this)

{
  double in_RDI;
  allocator *paVar1;
  string *in_stack_ffffffffffffff48;
  CLOptions *in_stack_ffffffffffffff50;
  allocator local_89;
  string local_88 [39];
  allocator local_61;
  string local_60 [55];
  allocator local_29;
  string local_28 [40];
  
  paVar1 = &local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"r,ra",paVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"RA in the CIRS coordinate frame (degrees)",&local_61);
  CLOptions::AddDoubleParam
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,(string *)paVar1,in_RDI);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"d,dec",&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff50,"DEC in the CIRS coordinate frame (degrees)",
             (allocator *)&stack0xffffffffffffff4f);
  CLOptions::AddDoubleParam
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,(string *)paVar1,in_RDI);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff4f);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  return;
}

Assistant:

inline
void CEExecOptions::AddCirsPars(void)
{
    AddDoubleParam("r,ra", "RA in the CIRS coordinate frame (degrees)", 0.0);
    AddDoubleParam("d,dec", "DEC in the CIRS coordinate frame (degrees)", 0.0);
}